

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

int getsym_op(void)

{
  uchar uVar1;
  byte bVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  pbVar8 = expr;
  uVar1 = *expr;
  ppuVar3 = __ctype_b_loc();
  lVar6 = 0;
LAB_0010c11b:
  do {
    pbVar7 = pbVar8 + 1;
    bVar2 = *pbVar8;
    iVar5 = (int)lVar6;
    pbVar8 = pbVar7;
    if (((((*ppuVar3)[(char)bVar2] >> 10 & 1) != 0) ||
        ((bVar2 - 0x2e < 0x32 && ((0x2000000040001U >> ((ulong)(bVar2 - 0x2e) & 0x3f) & 1) != 0))))
       || ((((*ppuVar3)[(char)bVar2] >> 0xb & 1) != 0 && (0 < iVar5)))) goto LAB_0010c143;
    if (((uVar1 != '@') && (uVar1 != '.')) || ((bVar2 != 0x2d && (bVar2 != 0x2b)))) {
      if (iVar5 == 1) {
        pp_Var4 = __ctype_toupper_loc();
        iVar5 = 1;
        if (((*pp_Var4)[symbol[1]] - 0x41U < 0x19) &&
           ((0x1800001U >> ((*pp_Var4)[symbol[1]] - 0x41U & 0x1f) & 1) != 0)) {
          error("Symbol is reserved (A, X or Y)!");
          iVar5 = 0;
        }
      }
      symbol[0] = (char)iVar5;
      symbol[(long)iVar5 + 1] = '\0';
      return iVar5;
    }
    expr = pbVar7;
  } while (0x3e < iVar5);
  goto LAB_0010c148;
LAB_0010c143:
  expr = pbVar7;
  if (iVar5 < 0x3f) {
LAB_0010c148:
    symbol[(long)iVar5 + 1] = bVar2;
    lVar6 = (long)iVar5 + 1;
    expr = pbVar7;
  }
  goto LAB_0010c11b;
}

Assistant:

int
getsym_op(void)
{
	int	valid;
	int	i;
	char c;
	char local_check;

	valid = 1;
	i = 0;

	/* get the symbol, stop to the first 'non symbol' char */
	local_check = *expr;
	while (valid) {
		c = *expr;
		if (isalpha(c) || c == '_' || c == '.' || c == '@' || (isdigit(c) && i >= 1)) {
			if (i < SBOLSZ - 1)
				symbol[++i] = c;
			expr++;
		}
		else if((local_check=='.' || local_check=='@') && ((c=='-') || (c=='+'))) {
                if (i < SBOLSZ - 1)
                    symbol[++i] = c;
                expr++;
             }
            else {
                valid = 0;
            }
	}

	/* is it a reserved symbol? */
	if (i == 1) {
		switch (toupper(symbol[1])) {
		case 'A':
		case 'X':
		case 'Y':
			error("Symbol is reserved (A, X or Y)!");
			i = 0;
		}
	}

	/* store symbol length */
	symbol[0] = i;
	symbol[i+1] = '\0';
	return (i);
}